

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall TPZMatrix<int>::Compare(TPZMatrix<int> *this,TPZSavable *copy,bool override)

{
  long lVar1;
  ostream *poVar2;
  stringstream sout;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if (copy != (TPZSavable *)0x0) {
    lVar1 = __dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
    if (lVar1 == 0) {
      return false;
    }
    if ((((this->super_TPZBaseMatrix).fRow == *(long *)(lVar1 + 8)) &&
        ((this->super_TPZBaseMatrix).fCol == *(long *)(lVar1 + 0x10))) &&
       ((this->super_TPZBaseMatrix).fDecomposed == *(char *)(lVar1 + 0x18))) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,
                             "virtual bool TPZMatrix<int>::Compare(TPZSavable *, bool) const [T = int]"
                            );
    std::operator<<(poVar2," did not compare ");
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<((ostream *)&std::cout,local_1c0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    if (override) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
                 ,0x4c5);
    }
  }
  return false;
}

Assistant:

bool TPZMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
	TPZMatrix<TVar> *copmat = dynamic_cast<TPZMatrix<TVar> *> (copy);
	if(!copmat) return false;
	bool result = true;
	if(fRow != copmat->fRow || fCol != copmat->fCol || fDecomposed != copmat->fDecomposed) result = false;
	if(!result)
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " did not compare ";
		LOGPZ_ERROR(loggerCheck,sout.str())
	}
	if(override && !result)
	{
		DebugStop();
	}
	return result;
}